

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

path_type CLI::detail::check_path(char *file)

{
  char cVar1;
  path_type pVar2;
  CLI *this;
  char *in_RCX;
  string_view str;
  error_code ec;
  path local_40;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)::std::_V2::system_category();
  this = (CLI *)strlen(file);
  str._M_str = in_RCX;
  str._M_len = (size_t)file;
  to_path_abi_cxx11_(&local_40,this,str);
  cVar1 = ::std::filesystem::status((path *)&local_40,(error_code *)&ec);
  std::filesystem::__cxx11::path::~path(&local_40);
  pVar2 = nonexistent;
  if (ec._M_value == 0) {
    if ((byte)(cVar1 + 1U) < 4) {
      pVar2 = (&DAT_0036e040)[(byte)(cVar1 + 1U)];
    }
    else {
      pVar2 = file;
    }
  }
  return pVar2;
}

Assistant:

CLI11_INLINE path_type check_path(const char *file) noexcept {
    std::error_code ec;
    auto stat = std::filesystem::status(to_path(file), ec);
    if(ec) {
        return path_type::nonexistent;
    }
    switch(stat.type()) {
    case std::filesystem::file_type::none:  // LCOV_EXCL_LINE
    case std::filesystem::file_type::not_found:
        return path_type::nonexistent;  // LCOV_EXCL_LINE
    case std::filesystem::file_type::directory:
        return path_type::directory;
    case std::filesystem::file_type::symlink:
    case std::filesystem::file_type::block:
    case std::filesystem::file_type::character:
    case std::filesystem::file_type::fifo:
    case std::filesystem::file_type::socket:
    case std::filesystem::file_type::regular:
    case std::filesystem::file_type::unknown:
    default:
        return path_type::file;
    }
}